

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O0

void __thiscall sfc::Tileset::save(Tileset *this,string *path)

{
  byte_vec_t local_30;
  string *local_18;
  string *path_local;
  Tileset *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  native_data(&local_30,this);
  write_file<unsigned_char>(path,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  return;
}

Assistant:

void Tileset::save(const std::string& path) const {
  write_file(path, native_data());
}